

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

CharReader * __thiscall Json::CharReaderBuilder::newCharReader(CharReaderBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  Value *pVVar10;
  CharReader *pCVar11;
  Value *this_00;
  OurFeatures local_40;
  
  this_00 = &this->settings_;
  pVVar10 = Value::operator[](this_00,"collectComments");
  bVar1 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"allowComments");
  bVar2 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"strictRoot");
  bVar3 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"allowDroppedNullPlaceholders");
  bVar4 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"allowNumericKeys");
  bVar5 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"allowSingleQuotes");
  bVar6 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"stackLimit");
  local_40.stackLimit_ = Value::asInt(pVVar10);
  pVVar10 = Value::operator[](this_00,"failIfExtra");
  bVar7 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"rejectDupKeys");
  bVar8 = Value::asBool(pVVar10);
  pVVar10 = Value::operator[](this_00,"allowSpecialFloats");
  bVar9 = Value::asBool(pVVar10);
  local_40.failIfExtra_ = bVar7;
  local_40.allowSingleQuotes_ = bVar6;
  local_40.strictRoot_ = bVar3;
  local_40.allowComments_ = bVar2;
  local_40.allowDroppedNullPlaceholders_ = bVar4;
  local_40.allowNumericKeys_ = bVar5;
  local_40.allowSpecialFloats_ = bVar9;
  local_40.rejectDupKeys_ = bVar8;
  pCVar11 = (CharReader *)operator_new(0x128);
  pCVar11->_vptr_CharReader = (_func_int **)&PTR__OurCharReader_006a79f0;
  *(bool *)&pCVar11[1]._vptr_CharReader = bVar1;
  OurReader::OurReader((OurReader *)(pCVar11 + 2),&local_40);
  return pCVar11;
}

Assistant:

CharReader* CharReaderBuilder::newCharReader() const
{
  bool collectComments = settings_["collectComments"].asBool();
  OurFeatures features = OurFeatures::all();
  features.allowComments_ = settings_["allowComments"].asBool();
  features.strictRoot_ = settings_["strictRoot"].asBool();
  features.allowDroppedNullPlaceholders_ = settings_["allowDroppedNullPlaceholders"].asBool();
  features.allowNumericKeys_ = settings_["allowNumericKeys"].asBool();
  features.allowSingleQuotes_ = settings_["allowSingleQuotes"].asBool();
  features.stackLimit_ = settings_["stackLimit"].asInt();
  features.failIfExtra_ = settings_["failIfExtra"].asBool();
  features.rejectDupKeys_ = settings_["rejectDupKeys"].asBool();
  features.allowSpecialFloats_ = settings_["allowSpecialFloats"].asBool();
  return new OurCharReader(collectComments, features);
}